

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::addClause(SAT *this,vec<Lit> *ps,bool one_watch)

{
  lbool lVar1;
  bool bVar2;
  uint uVar3;
  Lit *pLVar4;
  Lit *pLVar5;
  vec<Lit> *in_RSI;
  SAT *in_RDI;
  uint j;
  uint i;
  undefined1 in_stack_00000347;
  Clause *in_stack_00000348;
  SAT *in_stack_00000350;
  Lit in_stack_ffffffffffffffd0;
  lbool local_26;
  int8_t local_25;
  int in_stack_ffffffffffffffdc;
  undefined1 learnt;
  undefined4 in_stack_ffffffffffffffe0;
  uint nelems;
  uint local_18;
  
  nelems = 0;
  local_18 = 0;
  while( true ) {
    learnt = (undefined1)((uint)in_stack_ffffffffffffffdc >> 0x18);
    uVar3 = vec<Lit>::size(in_RSI);
    if (uVar3 <= local_18) {
      vec<Lit>::resize(in_RSI,nelems);
      uVar3 = vec<Lit>::size(in_RSI);
      if (uVar3 != 0) {
        ::Clause_new<vec<Lit>>((vec<Lit> *)CONCAT44(nelems,in_stack_ffffffffffffffe0),(bool)learnt);
        addClause(in_stack_00000350,in_stack_00000348,(bool)in_stack_00000347);
        return;
      }
      printf("=====UNSATISFIABLE=====\n");
      printf("%% Top level failure!\n");
      exit(0);
    }
    pLVar4 = vec<Lit>::operator[](in_RSI,local_18);
    in_stack_ffffffffffffffdc = pLVar4->x;
    lVar1 = value(in_RDI,in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffe0 = CONCAT13(lVar1.value,(int3)in_stack_ffffffffffffffe0);
    local_25 = ::l_True.value;
    bVar2 = lbool::operator==((lbool *)&stack0xffffffffffffffe3,::l_True);
    if (bVar2) break;
    vec<Lit>::operator[](in_RSI,local_18);
    local_26 = value(in_RDI,in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0.x = CONCAT13(::l_Undef.value,(int3)in_stack_ffffffffffffffd0.x);
    bVar2 = lbool::operator==(&local_26,::l_Undef);
    if (bVar2) {
      pLVar4 = vec<Lit>::operator[](in_RSI,local_18);
      uVar3 = nelems + 1;
      pLVar5 = vec<Lit>::operator[](in_RSI,nelems);
      pLVar5->x = pLVar4->x;
      nelems = uVar3;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void SAT::addClause(vec<Lit>& ps, bool one_watch) {
	unsigned int i;
	unsigned int j;
	for (i = j = 0; i < ps.size(); i++) {
		if (value(ps[i]) == l_True) {
			return;
		}
		if (value(ps[i]) == l_Undef) {
			ps[j++] = ps[i];
		}
	}
	ps.resize(j);
	if (ps.size() == 0) {
		assert(false);
		TL_FAIL();
	}
	addClause(*Clause_new(ps), one_watch);
}